

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::readFromFile(Dictionary *this,istream *in)

{
  bool bVar1;
  element_type *peVar2;
  ostream *poVar3;
  void *pvVar4;
  invalid_argument *this_00;
  int64_t in_RSI;
  Dictionary *in_RDI;
  Dictionary *unaff_retaddr;
  int64_t minThreshold;
  string word;
  string *in_stack_ffffffffffffff58;
  istream *in_stack_ffffffffffffff60;
  Dictionary *in_stack_ffffffffffffff68;
  Dictionary *in_stack_ffffffffffffff70;
  string *w;
  Dictionary *in_stack_ffffffffffffffd0;
  Dictionary *t;
  
  t = in_RDI;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0);
  w = (string *)0x1;
  while (bVar1 = readWord(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff58), bVar1) {
    add(in_stack_ffffffffffffffd0,w);
    if ((in_RDI->ntokens_ % 1000000 == 0) &&
       (peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x180225), 1 < peVar2->verbose)) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"\rRead ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI->ntokens_ / 1000000);
      poVar3 = std::operator<<(poVar3,"M words");
      std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
    }
    if (22500000.0 < (double)in_RDI->size_) {
      w = w + 1;
      threshold(unaff_retaddr,(int64_t)t,in_RSI);
    }
  }
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x180317);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x18032d);
  threshold(unaff_retaddr,(int64_t)t,in_RSI);
  initTableDiscard(in_stack_ffffffffffffff70);
  initNgrams(in_RDI);
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x180367);
  if (0 < peVar2->verbose) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\rRead ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI->ntokens_ / 1000000);
    poVar3 = std::operator<<(poVar3,"M words");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Number of words:  ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,in_RDI->nwords_);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Number of labels: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,in_RDI->nlabels_);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  if (in_RDI->size_ != 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"Empty vocabulary. Try a smaller -minCount value.");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Dictionary::readFromFile(std::istream& in) {
  std::string word;
  int64_t minThreshold = 1;
  while (readWord(in, word)) {
    add(word);
    if (ntokens_ % 1000000 == 0 && args_->verbose > 1) {
      std::cerr << "\rRead " << ntokens_ / 1000000 << "M words" << std::flush;
    }
    if (size_ > 0.75 * MAX_VOCAB_SIZE) {
      minThreshold++;
      threshold(minThreshold, minThreshold);
    }
  }
  threshold(args_->minCount, args_->minCountLabel);
  initTableDiscard();
  initNgrams();
  if (args_->verbose > 0) {
    std::cerr << "\rRead " << ntokens_ / 1000000 << "M words" << std::endl;
    std::cerr << "Number of words:  " << nwords_ << std::endl;
    std::cerr << "Number of labels: " << nlabels_ << std::endl;
  }
  if (size_ == 0) {
    throw std::invalid_argument(
        "Empty vocabulary. Try a smaller -minCount value.");
  }
}